

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O3

bool Assimp::IFC::ProcessCurve(IfcCurve *curve,TempMesh *meshout,ConversionData *conv)

{
  Curve *pCVar1;
  BoundedCurve *this;
  long *plVar2;
  size_type *psVar3;
  bool bVar4;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8 [2];
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  pCVar1 = Curve::Convert(curve,conv);
  if (pCVar1 == (Curve *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,
               *(char **)(&(curve->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem
                           .super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x10 +
                         (long)(curve->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper[-3]),&local_1d9);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x6eba60);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar3) {
      local_1d8.field_2._M_allocated_capacity = *psVar3;
      local_1d8.field_2._8_8_ = plVar2[3];
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    }
    else {
      local_1d8.field_2._M_allocated_capacity = *psVar3;
      local_1d8._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_1d8._M_string_length = plVar2[1];
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_198,
               &local_1d8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    bVar4 = false;
  }
  else {
    this = (BoundedCurve *)__dynamic_cast(pCVar1,&Curve::typeinfo,&BoundedCurve::typeinfo,0);
    if (this == (BoundedCurve *)0x0) {
      LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5b90b1);
    }
    else {
      BoundedCurve::SampleDiscrete(this,meshout);
      local_198._0_4_ =
           (int)((ulong)((long)(meshout->mVerts).
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(meshout->mVerts).
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&meshout->mVertcnt,(uint *)local_198);
    }
    bVar4 = this != (BoundedCurve *)0x0;
    (*pCVar1->_vptr_Curve[1])(pCVar1);
  }
  return bVar4;
}

Assistant:

bool ProcessCurve(const Schema_2x3::IfcCurve& curve,  TempMesh& meshout, ConversionData& conv)
{
    std::unique_ptr<const Curve> cv(Curve::Convert(curve,conv));
    if (!cv) {
        IFCImporter::LogWarn("skipping unknown IfcCurve entity, type is " + curve.GetClassName());
        return false;
    }

    // we must have a bounded curve at this point
    if (const BoundedCurve* bc = dynamic_cast<const BoundedCurve*>(cv.get())) {
        try {
            bc->SampleDiscrete(meshout);
        }
        catch(const  CurveError& cv) {
            IFCImporter::LogError(cv.mStr + " (error occurred while processing curve)");
            return false;
        }
        meshout.mVertcnt.push_back(static_cast<unsigned int>(meshout.mVerts.size()));
        return true;
    }

    IFCImporter::LogError("cannot use unbounded curve as profile");
    return false;
}